

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::WatWriter::WriteMemory(WatWriter *this,Memory *memory)

{
  NextChar in_R8D;
  string_view str;
  
  WritePuts(this,"(",None);
  WritePuts(this,"memory",Space);
  this->indent_ = this->indent_ + 2;
  str._M_str = (memory->name)._M_dataplus._M_p;
  str._M_len = (memory->name)._M_string_length;
  WriteNameOrIndex(this,str,this->memory_index_,in_R8D);
  WriteInlineExports(this,Memory,this->memory_index_);
  WriteInlineImport(this,Memory,this->memory_index_);
  WriteLimits(this,&memory->page_limits);
  if (memory->page_size != 0x10000) {
    WritePuts(this,"(",None);
    WritePuts(this,"pagesize",Space);
    this->indent_ = this->indent_ + 2;
    Writef(this,"%u",(ulong)memory->page_size);
    WriteClose(this,Space);
  }
  WriteClose(this,Newline);
  this->memory_index_ = this->memory_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteMemory(const Memory& memory) {
  WriteOpenSpace("memory");
  WriteNameOrIndex(memory.name, memory_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Memory, memory_index_);
  WriteInlineImport(ExternalKind::Memory, memory_index_);
  WriteLimits(memory.page_limits);
  if (memory.page_size != WABT_DEFAULT_PAGE_SIZE) {
    WriteOpenSpace("pagesize");
    Writef("%u", memory.page_size);
    WriteCloseSpace();
  }
  WriteCloseNewline();
  memory_index_++;
}